

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O1

uint64_t __thiscall CTxMemPool::CalculateDescendantMaximum(CTxMemPool *this,txiter entry)

{
  ulong uVar1;
  hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
  *phVar2;
  _Rb_tree_node_base *p_Var3;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>,_bool>
  pVar4;
  txiter candidate;
  vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  candidates;
  setEntries counted;
  ulong local_a0;
  hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
  local_98;
  hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
  local_90;
  void *local_88;
  void *pvStack_80;
  long local_78;
  hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
  local_70;
  _Rb_tree<_270907ca_> local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = 0;
  local_88 = (void *)0x0;
  pvStack_80 = (void *)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70.node = entry.node;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>
  ::
  _M_realloc_insert<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>const&>
            ((vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>
              *)&local_88,(iterator)0x0,&local_70);
  if (pvStack_80 == local_88) {
    local_a0 = 0;
  }
  else {
    local_a0 = 0;
    do {
      local_90.node =
           *(hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
             **)((long)pvStack_80 + -8);
      pvStack_80 = (void *)((long)pvStack_80 + -8);
      pVar4 = std::
              _Rb_tree<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<...lti_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>
              ::
              _M_insert_unique<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>const&>
                        ((_Rb_tree<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<___lti_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>
                          *)&local_68,&local_90);
      if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        if (*(long *)((long)&((local_90.node)->
                             super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                             ).
                             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                             .
                             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                             .
                             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                             .
                             super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                             .super_pod_value_holder<CTxMemPoolEntry>.space + 0x38) == 0) {
          uVar1 = *(ulong *)((long)&((local_90.node)->
                                    super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                    ).
                                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                    .
                                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                    .
                                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                    .
                                    super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                    .super_pod_value_holder<CTxMemPoolEntry>.space + 200);
          if (local_a0 <= uVar1) {
            local_a0 = uVar1;
          }
        }
        else {
          phVar2 = &(local_90.node)->
                    super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
          ;
          for (p_Var3 = *(_Rb_tree_node_base **)
                         ((long)&((local_90.node)->
                                 super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                 ).
                                 super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                 .
                                 super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                 .
                                 super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                 .
                                 super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                 .super_pod_value_holder<CTxMemPoolEntry>.space + 0x28);
              p_Var3 != (_Rb_tree_node_base *)
                        ((long)&(phVar2->
                                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                ).
                                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                .
                                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                .
                                super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                .super_pod_value_holder<CTxMemPoolEntry>.space + 0x18U);
              p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
            local_98.node =
                 *(hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                   **)(p_Var3 + 1);
            std::
            vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>
            ::
            emplace_back<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>
                      ((vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>
                        *)&local_88,&local_98);
          }
        }
      }
    } while (pvStack_80 != local_88);
  }
  std::_Rb_tree<$270907ca$>::~_Rb_tree(&local_68);
  if (local_88 != (void *)0x0) {
    operator_delete(local_88,local_78 - (long)local_88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_a0;
}

Assistant:

uint64_t CTxMemPool::CalculateDescendantMaximum(txiter entry) const {
    // find parent with highest descendant count
    std::vector<txiter> candidates;
    setEntries counted;
    candidates.push_back(entry);
    uint64_t maximum = 0;
    while (candidates.size()) {
        txiter candidate = candidates.back();
        candidates.pop_back();
        if (!counted.insert(candidate).second) continue;
        const CTxMemPoolEntry::Parents& parents = candidate->GetMemPoolParentsConst();
        if (parents.size() == 0) {
            maximum = std::max(maximum, candidate->GetCountWithDescendants());
        } else {
            for (const CTxMemPoolEntry& i : parents) {
                candidates.push_back(mapTx.iterator_to(i));
            }
        }
    }
    return maximum;
}